

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_connect_op.hpp
# Opt level: O0

void asio::detail::
     reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  long in_RDI;
  fenced_block b;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> handler;
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void> w;
  ptr p;
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *o;
  undefined4 in_stack_ffffffffffffff48;
  half_t in_stack_ffffffffffffff4c;
  function<void_(const_std::error_code_&)> *in_stack_ffffffffffffff50;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *in_stack_ffffffffffffff58
  ;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *in_stack_ffffffffffffff60
  ;
  
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>::
  handler_work((handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>
                *)in_stack_ffffffffffffff50,
               (handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>
                *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::binder1
            (in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->handler_,
             (error_code *)in_stack_ffffffffffffff50);
  ptr::reset((ptr *)in_stack_ffffffffffffff50);
  if (in_RDI != 0) {
    std_fenced_block::std_fenced_block
              ((std_fenced_block *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    handler_work<std::function<void(std::error_code_const&)>,asio::any_io_executor,void>::
    complete<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
              ((handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>
                *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std_fenced_block::~std_fenced_block((std_fenced_block *)in_stack_ffffffffffffff58);
  }
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::~binder1
            ((binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)0x7c8710);
  handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>::
  ~handler_work((handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>
                 *)0x7c871a);
  ptr::~ptr((ptr *)0x7c8724);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    ASIO_ASSUME(base != 0);
    reactive_socket_connect_op* o
      (static_cast<reactive_socket_connect_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder1<Handler, asio::error_code>
      handler(o->handler_, o->ec_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }